

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_persistence_matrix_field_operators.cpp
# Opt level: O3

void test_z2_standart_field_operators<Gudhi::persistence_fields::Zp_field_operators<unsigned_int,void>>
               (Zp_field_operators<unsigned_int,_void> *op)

{
  Zp_field_operators<unsigned_int,_void> *pZVar1;
  uint uVar2;
  uint uVar3;
  byte bVar4;
  undefined8 in_RAX;
  uint uVar5;
  uint uVar6;
  uint local_52c [2];
  uint z21;
  uint *local_520;
  uint *local_518;
  undefined **local_510;
  ulong local_508;
  shared_count sStack_500;
  uint **local_4f8;
  undefined **local_4f0;
  undefined1 local_4e8;
  undefined8 *local_4e0;
  undefined ***local_4d8;
  undefined **local_4d0;
  char *local_4c8;
  undefined8 *local_4c0;
  char *local_4b8;
  undefined1 local_4b0 [8];
  undefined8 local_4a8;
  shared_count sStack_4a0;
  ulong local_498;
  char *local_490;
  char *local_488;
  uint local_47c;
  Zp_field_operators<unsigned_int,_void> *local_478;
  char *local_470;
  char *local_468;
  undefined1 *local_460;
  undefined1 *local_458;
  char *local_450;
  char *local_448;
  char *local_440;
  char *local_438;
  undefined1 *local_430;
  undefined1 *local_428;
  char *local_420;
  char *local_418;
  char *local_410;
  char *local_408;
  undefined1 *local_400;
  undefined1 *local_3f8;
  char *local_3f0;
  char *local_3e8;
  char *local_3e0;
  char *local_3d8;
  undefined1 *local_3d0;
  undefined1 *local_3c8;
  char *local_3c0;
  char *local_3b8;
  undefined1 *local_3b0;
  undefined1 *local_3a8;
  char *local_3a0;
  char *local_398;
  undefined1 *local_390;
  undefined1 *local_388;
  char *local_380;
  char *local_378;
  undefined1 *local_370;
  undefined1 *local_368;
  char *local_360;
  char *local_358;
  undefined1 *local_350;
  undefined1 *local_348;
  char *local_340;
  char *local_338;
  undefined1 *local_330;
  undefined1 *local_328;
  char *local_320;
  char *local_318;
  undefined1 *local_310;
  undefined1 *local_308;
  char *local_300;
  char *local_2f8;
  undefined1 *local_2f0;
  undefined1 *local_2e8;
  char *local_2e0;
  char *local_2d8;
  undefined1 *local_2d0;
  undefined1 *local_2c8;
  char *local_2c0;
  char *local_2b8;
  undefined1 *local_2b0;
  undefined1 *local_2a8;
  char *local_2a0;
  char *local_298;
  undefined1 *local_290;
  undefined1 *local_288;
  char *local_280;
  char *local_278;
  undefined1 *local_270;
  undefined1 *local_268;
  char *local_260;
  char *local_258;
  undefined1 *local_250;
  undefined1 *local_248;
  char *local_240;
  char *local_238;
  undefined1 *local_230;
  undefined1 *local_228;
  char *local_220;
  char *local_218;
  undefined1 *local_210;
  undefined1 *local_208;
  char *local_200;
  char *local_1f8;
  undefined1 *local_1f0;
  undefined1 *local_1e8;
  char *local_1e0;
  char *local_1d8;
  undefined1 *local_1d0;
  undefined1 *local_1c8;
  char *local_1c0;
  char *local_1b8;
  undefined1 *local_1b0;
  undefined1 *local_1a8;
  char *local_1a0;
  char *local_198;
  undefined1 *local_190;
  undefined1 *local_188;
  char *local_180;
  char *local_178;
  undefined1 *local_170;
  undefined1 *local_168;
  char *local_160;
  char *local_158;
  undefined1 *local_150;
  undefined1 *local_148;
  char *local_140;
  char *local_138;
  undefined1 *local_130;
  undefined1 *local_128;
  char *local_120;
  char *local_118;
  undefined1 *local_110;
  undefined1 *local_108;
  char *local_100;
  char *local_f8;
  undefined1 *local_f0;
  undefined1 *local_e8;
  char *local_e0;
  char *local_d8;
  undefined1 *local_d0;
  undefined1 *local_c8;
  char *local_c0;
  char *local_b8;
  undefined1 *local_b0;
  undefined1 *local_a8;
  char *local_a0;
  char *local_98;
  undefined1 *local_90;
  undefined1 *local_88;
  char *local_80;
  char *local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  char *local_60;
  char *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  char *local_40;
  char *local_38;
  
  z21 = 7;
  uVar6 = op->characteristic_;
  local_47c = (uint)CONCAT71((int7)((ulong)in_RAX >> 8),7);
  if (uVar6 < 8) {
    local_47c = (uint)(byte)(7 % (byte)uVar6);
    if (2 < uVar6) goto LAB_00107e91;
    local_498 = (ulong)(byte)(2 % (byte)uVar6);
  }
  else {
LAB_00107e91:
    local_498 = 2;
  }
  local_40 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field_operators.cpp"
  ;
  local_38 = "";
  local_50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_48 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_40,0x25);
  local_4c8 = (char *)((ulong)local_4c8 & 0xffffffffffffff00);
  local_4d0 = &PTR__lazy_ostream_00120ce0;
  local_4c0 = &boost::unit_test::lazy_ostream::inst;
  local_4b8 = "";
  local_52c[0] = z21 * 2 + 3;
  if (op->characteristic_ <= local_52c[0]) {
    local_52c[0] = local_52c[0] % op->characteristic_;
  }
  local_518 = local_52c;
  local_4b0[0] = local_52c[0] == 1;
  local_520 = local_52c + 1;
  local_52c[1] = 1;
  local_4a8 = 0;
  sStack_4a0.pi_ = (sp_counted_base *)0x0;
  local_490 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field_operators.cpp"
  ;
  local_488 = "";
  local_4d8 = (undefined ***)&local_518;
  local_4e8 = 0;
  local_4f0 = &PTR__lazy_ostream_00120d20;
  local_4e0 = &boost::unit_test::lazy_ostream::inst;
  local_4f8 = &local_520;
  local_508 = local_508 & 0xffffffffffffff00;
  local_510 = &PTR__lazy_ostream_00120ca0;
  sStack_500.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_478 = op;
  boost::test_tools::tt_detail::report_assertion
            (local_4b0,&local_4d0,&local_490,0x25,1,2,2,"op.multiply_and_add(z21, z22, 3u)",
             &local_4f0,"1",&local_510);
  uVar6 = local_47c;
  bVar4 = (byte)local_47c;
  boost::detail::shared_count::~shared_count(&sStack_4a0);
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field_operators.cpp"
  ;
  local_58 = "";
  local_70 = &boost::unit_test::basic_cstring<char_const>::null;
  local_68 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_60,0x26);
  pZVar1 = local_478;
  local_4c8 = (char *)((ulong)local_4c8 & 0xffffffffffffff00);
  local_4d0 = &PTR__lazy_ostream_00120ce0;
  local_4c0 = &boost::unit_test::lazy_ostream::inst;
  local_4b8 = "";
  local_52c[0] = (int)local_498 * (uVar6 & 0xff) + 3;
  if (local_478->characteristic_ <= local_52c[0]) {
    local_52c[0] = (uint)(byte)(((ushort)local_52c[0] & 0xff) %
                               (ushort)(byte)local_478->characteristic_);
  }
  local_52c[1] = 1;
  local_4b0[0] = local_52c[0] == 1;
  local_4a8 = 0;
  sStack_4a0.pi_ = (sp_counted_base *)0x0;
  local_490 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field_operators.cpp"
  ;
  local_488 = "";
  local_518 = local_52c;
  local_4e8 = 0;
  local_4f0 = &PTR__lazy_ostream_00120d20;
  local_4e0 = &boost::unit_test::lazy_ostream::inst;
  local_4d8 = (undefined ***)&local_518;
  local_520 = local_52c + 1;
  local_508 = local_508 & 0xffffffffffffff00;
  local_510 = &PTR__lazy_ostream_00120ca0;
  sStack_500.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_4f8 = &local_520;
  boost::test_tools::tt_detail::report_assertion
            (local_4b0,&local_4d0,&local_490,0x26,1,2,2,"op.multiply_and_add(z23, z24, T(3))",
             &local_4f0,"1",&local_510);
  boost::detail::shared_count::~shared_count(&sStack_4a0);
  local_80 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field_operators.cpp"
  ;
  local_78 = "";
  local_90 = &boost::unit_test::basic_cstring<char_const>::null;
  local_88 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_80,0x29);
  local_4c8 = (char *)((ulong)local_4c8 & 0xffffffffffffff00);
  local_4d0 = &PTR__lazy_ostream_00120ce0;
  local_4c0 = &boost::unit_test::lazy_ostream::inst;
  local_4b8 = "";
  local_52c[0] = z21 * 3 + 6;
  if (pZVar1->characteristic_ <= local_52c[0]) {
    local_52c[0] = local_52c[0] % pZVar1->characteristic_;
  }
  local_52c[1] = 1;
  local_4b0[0] = local_52c[0] == 1;
  local_4a8 = 0;
  sStack_4a0.pi_ = (sp_counted_base *)0x0;
  local_490 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field_operators.cpp"
  ;
  local_488 = "";
  local_518 = local_52c;
  local_4e8 = 0;
  local_4f0 = &PTR__lazy_ostream_00120d20;
  local_4e0 = &boost::unit_test::lazy_ostream::inst;
  local_4d8 = (undefined ***)&local_518;
  local_520 = local_52c + 1;
  local_508 = local_508 & 0xffffffffffffff00;
  local_510 = &PTR__lazy_ostream_00120ca0;
  sStack_500.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_4f8 = &local_520;
  boost::test_tools::tt_detail::report_assertion
            (local_4b0,&local_4d0,&local_490,0x29,1,2,2,"op.add_and_multiply(z21, z22, 3u)",
             &local_4f0,"1",&local_510);
  boost::detail::shared_count::~shared_count(&sStack_4a0);
  local_a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field_operators.cpp"
  ;
  local_98 = "";
  local_b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_a0,0x2a);
  local_4c8 = (char *)((ulong)local_4c8 & 0xffffffffffffff00);
  local_4d0 = &PTR__lazy_ostream_00120ce0;
  local_4c0 = &boost::unit_test::lazy_ostream::inst;
  local_4b8 = "";
  local_52c[0] = ((int)local_498 + (uVar6 & 0xff)) * 3;
  if (pZVar1->characteristic_ <= local_52c[0]) {
    local_52c[0] = (uint)(byte)((byte)local_52c[0] % (byte)pZVar1->characteristic_);
  }
  local_52c[1] = 1;
  local_4b0[0] = local_52c[0] == 1;
  local_4a8 = 0;
  sStack_4a0.pi_ = (sp_counted_base *)0x0;
  local_490 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field_operators.cpp"
  ;
  local_488 = "";
  local_518 = local_52c;
  local_4e8 = 0;
  local_4f0 = &PTR__lazy_ostream_00120d20;
  local_4e0 = &boost::unit_test::lazy_ostream::inst;
  local_4d8 = (undefined ***)&local_518;
  local_520 = local_52c + 1;
  local_508 = local_508 & 0xffffffffffffff00;
  local_510 = &PTR__lazy_ostream_00120ca0;
  sStack_500.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_4f8 = &local_520;
  boost::test_tools::tt_detail::report_assertion
            (local_4b0,&local_4d0,&local_490,0x2a,1,2,2,"op.add_and_multiply(z23, z24, T(3))",
             &local_4f0,"1",&local_510);
  boost::detail::shared_count::~shared_count(&sStack_4a0);
  local_c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field_operators.cpp"
  ;
  local_b8 = "";
  local_d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_c8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_c0,0x2d);
  local_4c8 = (char *)((ulong)local_4c8 & 0xffffffffffffff00);
  local_4d0 = &PTR__lazy_ostream_00120ce0;
  local_4c0 = &boost::unit_test::lazy_ostream::inst;
  local_4b8 = "";
  uVar3 = pZVar1->characteristic_;
  uVar5 = z21;
  if (uVar3 <= z21) {
    uVar5 = z21 % uVar3;
  }
  uVar2 = 2;
  if (uVar3 < 3) {
    uVar2 = (uint)(byte)(2 % (byte)uVar3);
  }
  local_52c[0] = uVar3;
  if (uVar5 + uVar2 < uVar3) {
    local_52c[0] = 0;
  }
  if (CARRY4(uVar5,uVar2)) {
    local_52c[0] = uVar3;
  }
  local_52c[0] = (uVar5 + uVar2) - local_52c[0];
  local_4b0[0] = local_52c[0] == 1;
  local_52c[1] = 1;
  local_4a8 = 0;
  sStack_4a0.pi_ = (sp_counted_base *)0x0;
  local_490 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field_operators.cpp"
  ;
  local_488 = "";
  local_518 = local_52c;
  local_4e8 = 0;
  local_4f0 = &PTR__lazy_ostream_00120d20;
  local_4e0 = &boost::unit_test::lazy_ostream::inst;
  local_4d8 = (undefined ***)&local_518;
  local_520 = local_52c + 1;
  local_508 = local_508 & 0xffffffffffffff00;
  local_510 = &PTR__lazy_ostream_00120ca0;
  sStack_500.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_4f8 = &local_520;
  boost::test_tools::tt_detail::report_assertion
            (local_4b0,&local_4d0,&local_490,0x2d,1,2,2,"op.add(z21, z22)",&local_4f0,"1",&local_510
            );
  boost::detail::shared_count::~shared_count(&sStack_4a0);
  local_e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field_operators.cpp"
  ;
  local_d8 = "";
  local_f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_e8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_e0,0x2e);
  local_4c8 = (char *)((ulong)local_4c8 & 0xffffffffffffff00);
  local_4d0 = &PTR__lazy_ostream_00120ce0;
  local_4c0 = &boost::unit_test::lazy_ostream::inst;
  local_4b8 = "";
  local_52c[0] = pZVar1->characteristic_;
  uVar5 = uVar6 & 0xff;
  uVar3 = uVar6 & 0xff;
  if (local_52c[0] <= uVar5) {
    uVar3 = (uint)(byte)((byte)local_47c % (byte)local_52c[0]);
  }
  uVar2 = (uint)local_498;
  if (local_52c[0] <= uVar2) {
    uVar2 = (uint)(byte)(((ushort)local_498 & 0xff) % (ushort)(byte)local_52c[0]);
  }
  if (uVar2 + uVar3 < local_52c[0]) {
    local_52c[0] = 0;
  }
  local_52c[0] = (uVar2 + uVar3) - local_52c[0];
  local_4b0[0] = local_52c[0] == 1;
  local_52c[1] = 1;
  local_4a8 = 0;
  sStack_4a0.pi_ = (sp_counted_base *)0x0;
  local_490 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field_operators.cpp"
  ;
  local_488 = "";
  local_518 = local_52c;
  local_4e8 = 0;
  local_4f0 = &PTR__lazy_ostream_00120d20;
  local_4e0 = &boost::unit_test::lazy_ostream::inst;
  local_4d8 = (undefined ***)&local_518;
  local_520 = local_52c + 1;
  local_508 = local_508 & 0xffffffffffffff00;
  local_510 = &PTR__lazy_ostream_00120ca0;
  sStack_500.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_4f8 = &local_520;
  boost::test_tools::tt_detail::report_assertion
            (local_4b0,&local_4d0,&local_490,0x2e,1,2,2,"op.add(z23, z24)",&local_4f0,"1",&local_510
            );
  boost::detail::shared_count::~shared_count(&sStack_4a0);
  local_100 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field_operators.cpp"
  ;
  local_f8 = "";
  local_110 = &boost::unit_test::basic_cstring<char_const>::null;
  local_108 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_100,0x2f);
  local_4c8 = (char *)((ulong)local_4c8 & 0xffffffffffffff00);
  local_4d0 = &PTR__lazy_ostream_00120ce0;
  local_4c0 = &boost::unit_test::lazy_ostream::inst;
  local_4b8 = "";
  local_52c[0] = pZVar1->characteristic_;
  if (local_52c[0] <= (uVar6 & 0xff)) {
    uVar5 = (uint)(byte)((byte)local_47c % (byte)local_52c[0]);
  }
  uVar3 = 3;
  if (local_52c[0] < 4) {
    uVar3 = (uint)(byte)(3 % (byte)local_52c[0]);
  }
  if (uVar3 + uVar5 < local_52c[0]) {
    local_52c[0] = 0;
  }
  local_52c[0] = (uVar3 + uVar5) - local_52c[0];
  local_4b0[0] = local_52c[0] == 0;
  local_52c[1] = 0;
  local_4a8 = 0;
  sStack_4a0.pi_ = (sp_counted_base *)0x0;
  local_490 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field_operators.cpp"
  ;
  local_488 = "";
  local_518 = local_52c;
  local_4e8 = 0;
  local_4f0 = &PTR__lazy_ostream_00120d20;
  local_4e0 = &boost::unit_test::lazy_ostream::inst;
  local_4d8 = (undefined ***)&local_518;
  local_520 = local_52c + 1;
  local_508 = local_508 & 0xffffffffffffff00;
  local_510 = &PTR__lazy_ostream_00120ca0;
  sStack_500.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_4f8 = &local_520;
  boost::test_tools::tt_detail::report_assertion
            (local_4b0,&local_4d0,&local_490,0x2f,1,2,2,"op.add(z23, T(3))",&local_4f0,"0",
             &local_510);
  boost::detail::shared_count::~shared_count(&sStack_4a0);
  local_120 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field_operators.cpp"
  ;
  local_118 = "";
  local_130 = &boost::unit_test::basic_cstring<char_const>::null;
  local_128 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_120,0x30);
  pZVar1 = local_478;
  local_4c8 = (char *)((ulong)local_4c8 & 0xffffffffffffff00);
  local_4d0 = &PTR__lazy_ostream_00120ce0;
  local_4c0 = &boost::unit_test::lazy_ostream::inst;
  local_4b8 = "";
  local_52c[0] = local_478->characteristic_;
  uVar3 = (uint)local_498;
  if (uVar3 < local_52c[0]) {
    uVar5 = 3;
    if (local_52c[0] < 4) goto LAB_001088f0;
  }
  else {
    uVar3 = (uint)(byte)(((ushort)local_498 & 0xff) % (ushort)(byte)local_52c[0]);
LAB_001088f0:
    uVar5 = (uint)(byte)(3 % (byte)local_52c[0]);
  }
  if (uVar3 + uVar5 < local_52c[0]) {
    local_52c[0] = 0;
  }
  local_52c[0] = (uVar3 + uVar5) - local_52c[0];
  local_4b0[0] = local_52c[0] == 1;
  local_52c[1] = 1;
  local_4a8 = 0;
  sStack_4a0.pi_ = (sp_counted_base *)0x0;
  local_490 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field_operators.cpp"
  ;
  local_488 = "";
  local_518 = local_52c;
  local_4e8 = 0;
  local_4f0 = &PTR__lazy_ostream_00120d20;
  local_4e0 = &boost::unit_test::lazy_ostream::inst;
  local_4d8 = (undefined ***)&local_518;
  local_520 = local_52c + 1;
  local_508 = local_508 & 0xffffffffffffff00;
  local_510 = &PTR__lazy_ostream_00120ca0;
  sStack_500.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_4f8 = &local_520;
  boost::test_tools::tt_detail::report_assertion
            (local_4b0,&local_4d0,&local_490,0x30,1,2,2,"op.add(z24, T(3))",&local_4f0,"1",
             &local_510);
  boost::detail::shared_count::~shared_count(&sStack_4a0);
  local_140 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field_operators.cpp"
  ;
  local_138 = "";
  local_150 = &boost::unit_test::basic_cstring<char_const>::null;
  local_148 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_140,0x31);
  local_4c8 = (char *)((ulong)local_4c8 & 0xffffffffffffff00);
  local_4d0 = &PTR__lazy_ostream_00120ce0;
  local_4c0 = &boost::unit_test::lazy_ostream::inst;
  local_4b8 = "";
  local_52c[0] = pZVar1->characteristic_;
  uVar3 = 6;
  if (local_52c[0] < 7) {
    uVar3 = (uint)(byte)(6 % (byte)local_52c[0]);
  }
  if (local_52c[0] <= (uVar6 & 0xff)) {
    bVar4 = (byte)local_47c % (byte)local_52c[0];
  }
  if (bVar4 + uVar3 < local_52c[0]) {
    local_52c[0] = 0;
  }
  local_52c[0] = (bVar4 + uVar3) - local_52c[0];
  local_4b0[0] = local_52c[0] == 1;
  local_52c[1] = 1;
  local_4a8 = 0;
  sStack_4a0.pi_ = (sp_counted_base *)0x0;
  local_490 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field_operators.cpp"
  ;
  local_488 = "";
  local_518 = local_52c;
  local_4e8 = 0;
  local_4f0 = &PTR__lazy_ostream_00120d20;
  local_4e0 = &boost::unit_test::lazy_ostream::inst;
  local_4d8 = (undefined ***)&local_518;
  local_520 = local_52c + 1;
  local_508 = local_508 & 0xffffffffffffff00;
  local_510 = &PTR__lazy_ostream_00120ca0;
  sStack_500.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_4f8 = &local_520;
  boost::test_tools::tt_detail::report_assertion
            (local_4b0,&local_4d0,&local_490,0x31,1,2,2,"op.add(op.get_value(6u), z23)",&local_4f0,
             "1",&local_510);
  boost::detail::shared_count::~shared_count(&sStack_4a0);
  local_160 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field_operators.cpp"
  ;
  local_158 = "";
  local_170 = &boost::unit_test::basic_cstring<char_const>::null;
  local_168 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_160,0x32);
  local_4c8 = (char *)((ulong)local_4c8 & 0xffffffffffffff00);
  local_4d0 = &PTR__lazy_ostream_00120ce0;
  local_4c0 = &boost::unit_test::lazy_ostream::inst;
  local_4b8 = "";
  local_52c[0] = pZVar1->characteristic_;
  uVar6 = 6;
  if (local_52c[0] < 7) {
    uVar6 = (uint)(byte)(6 % (byte)local_52c[0]);
  }
  uVar3 = (uint)local_498;
  local_518 = local_52c;
  local_4d8 = (undefined ***)&local_518;
  local_4f8 = &local_520;
  if (local_52c[0] <= uVar3) {
    uVar3 = (uint)(byte)(((ushort)local_498 & 0xff) % (ushort)(byte)local_52c[0]);
  }
  if (uVar3 + uVar6 < local_52c[0]) {
    local_52c[0] = 0;
  }
  local_52c[0] = (uVar3 + uVar6) - local_52c[0];
  local_4b0[0] = local_52c[0] == 0;
  local_52c[1] = 0;
  local_4a8 = 0;
  sStack_4a0.pi_ = (sp_counted_base *)0x0;
  local_490 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field_operators.cpp"
  ;
  local_488 = "";
  local_4e8 = 0;
  local_4f0 = &PTR__lazy_ostream_00120d20;
  local_4e0 = &boost::unit_test::lazy_ostream::inst;
  local_520 = local_52c + 1;
  local_508 = local_508 & 0xffffffffffffff00;
  local_510 = &PTR__lazy_ostream_00120ca0;
  sStack_500.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  boost::test_tools::tt_detail::report_assertion
            (local_4b0,&local_4d0,&local_490,0x32,1,2,2,"op.add(op.get_value(6u), z24)",&local_4f0,
             "0",&local_510);
  boost::detail::shared_count::~shared_count(&sStack_4a0);
  uVar6 = pZVar1->characteristic_;
  if (uVar6 <= z21) {
    z21 = z21 % uVar6;
  }
  uVar3 = 3;
  if (uVar6 < 4) {
    uVar3 = (uint)(byte)(3 % (byte)uVar6);
  }
  uVar5 = uVar6;
  if (z21 + uVar3 < uVar6) {
    uVar5 = 0;
  }
  if (CARRY4(z21,uVar3)) {
    uVar5 = uVar6;
  }
  z21 = (z21 + uVar3) - uVar5;
  local_180 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field_operators.cpp"
  ;
  local_178 = "";
  local_190 = &boost::unit_test::basic_cstring<char_const>::null;
  local_188 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_180,0x34);
  local_4c8 = (char *)((ulong)local_4c8 & 0xffffffffffffff00);
  local_4d0 = &PTR__lazy_ostream_00120ce0;
  local_4c0 = &boost::unit_test::lazy_ostream::inst;
  local_4b8 = "";
  local_4b0[0] = z21 == 0;
  local_52c[0] = 0;
  local_4a8 = 0;
  sStack_4a0.pi_ = (sp_counted_base *)0x0;
  local_490 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field_operators.cpp"
  ;
  local_488 = "";
  local_4e8 = 0;
  local_4f0 = &PTR__lazy_ostream_00120d20;
  local_4e0 = &boost::unit_test::lazy_ostream::inst;
  local_4d8 = (undefined ***)&local_518;
  local_520 = local_52c;
  local_508 = local_508 & 0xffffffffffffff00;
  local_510 = &PTR__lazy_ostream_00120ca0;
  sStack_500.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_4f8 = &local_520;
  local_518 = &z21;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_4a0);
  uVar6 = pZVar1->characteristic_;
  if (uVar6 <= z21) {
    z21 = z21 % uVar6;
  }
  uVar3 = 2;
  if (uVar6 < 3) {
    uVar3 = (uint)(byte)(2 % (byte)uVar6);
  }
  uVar5 = uVar6;
  if (z21 + uVar3 < uVar6) {
    uVar5 = 0;
  }
  if (CARRY4(z21,uVar3)) {
    uVar5 = uVar6;
  }
  z21 = (z21 + uVar3) - uVar5;
  local_1a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field_operators.cpp"
  ;
  local_198 = "";
  local_1b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1a8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1a0,0x36);
  local_4c8 = (char *)((ulong)local_4c8 & 0xffffffffffffff00);
  local_4d0 = &PTR__lazy_ostream_00120ce0;
  local_4c0 = &boost::unit_test::lazy_ostream::inst;
  local_4b8 = "";
  local_4b0[0] = z21 == 0;
  local_52c[0] = 0;
  local_4a8 = 0;
  sStack_4a0.pi_ = (sp_counted_base *)0x0;
  local_490 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field_operators.cpp"
  ;
  local_488 = "";
  local_518 = &z21;
  local_4e8 = 0;
  local_4f0 = &PTR__lazy_ostream_00120d20;
  local_4e0 = &boost::unit_test::lazy_ostream::inst;
  local_4d8 = (undefined ***)&local_518;
  local_520 = local_52c;
  local_508 = local_508 & 0xffffffffffffff00;
  local_510 = &PTR__lazy_ostream_00120ca0;
  sStack_500.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_4f8 = &local_520;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_4a0);
  uVar6 = z21;
  if (pZVar1->characteristic_ <= z21) {
    uVar6 = z21 % pZVar1->characteristic_;
  }
  local_1c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field_operators.cpp"
  ;
  local_1b8 = "";
  local_1d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1c8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1c0,0x3a);
  local_4c8 = (char *)((ulong)local_4c8 & 0xffffffffffffff00);
  local_4d0 = &PTR__lazy_ostream_00120ce0;
  local_4c0 = &boost::unit_test::lazy_ostream::inst;
  local_4b8 = "";
  local_52c[0] = pZVar1->characteristic_;
  uVar3 = z21;
  if (local_52c[0] <= z21) {
    uVar3 = z21 % local_52c[0];
  }
  uVar5 = 2;
  if (local_52c[0] < 3) {
    uVar5 = (uint)(byte)(2 % (byte)local_52c[0]);
  }
  if (uVar5 <= uVar3) {
    local_52c[0] = 0;
  }
  local_52c[0] = local_52c[0] + (uVar3 - uVar5);
  local_4b0[0] = local_52c[0] == 0;
  local_52c[1] = 0;
  local_4a8 = 0;
  sStack_4a0.pi_ = (sp_counted_base *)0x0;
  local_490 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field_operators.cpp"
  ;
  local_488 = "";
  local_518 = local_52c;
  local_4e8 = 0;
  local_4f0 = &PTR__lazy_ostream_00120d20;
  local_4e0 = &boost::unit_test::lazy_ostream::inst;
  local_4d8 = (undefined ***)&local_518;
  local_520 = local_52c + 1;
  local_508 = local_508 & 0xffffffffffffff00;
  local_510 = &PTR__lazy_ostream_00120ca0;
  sStack_500.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_4f8 = &local_520;
  boost::test_tools::tt_detail::report_assertion
            (local_4b0,&local_4d0,&local_490,0x3a,1,2,2,"op.subtract(z21, z22)",&local_4f0,"0",
             &local_510);
  boost::detail::shared_count::~shared_count(&sStack_4a0);
  local_1e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field_operators.cpp"
  ;
  local_1d8 = "";
  local_1f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1e8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1e0,0x3b);
  local_4c8 = (char *)((ulong)local_4c8 & 0xffffffffffffff00);
  local_4d0 = &PTR__lazy_ostream_00120ce0;
  local_4c0 = &boost::unit_test::lazy_ostream::inst;
  local_4b8 = "";
  local_52c[0] = pZVar1->characteristic_;
  uVar3 = uVar6;
  if (local_52c[0] <= uVar6) {
    uVar3 = uVar6 % local_52c[0];
  }
  uVar5 = (uint)local_498;
  if (local_52c[0] <= uVar5) {
    uVar5 = (uint)(byte)(((ushort)local_498 & 0xff) % (ushort)(byte)local_52c[0]);
  }
  if (uVar5 <= uVar3) {
    local_52c[0] = 0;
  }
  local_52c[0] = local_52c[0] + (uVar3 - uVar5);
  local_4b0[0] = local_52c[0] == 0;
  local_52c[1] = 0;
  local_4a8 = 0;
  sStack_4a0.pi_ = (sp_counted_base *)0x0;
  local_490 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field_operators.cpp"
  ;
  local_488 = "";
  local_518 = local_52c;
  local_4e8 = 0;
  local_4f0 = &PTR__lazy_ostream_00120d20;
  local_4e0 = &boost::unit_test::lazy_ostream::inst;
  local_4d8 = (undefined ***)&local_518;
  local_520 = local_52c + 1;
  local_508 = local_508 & 0xffffffffffffff00;
  local_510 = &PTR__lazy_ostream_00120ca0;
  sStack_500.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_4f8 = &local_520;
  boost::test_tools::tt_detail::report_assertion
            (local_4b0,&local_4d0,&local_490,0x3b,1,2,2,"op.subtract(z23, z24)",&local_4f0,"0",
             &local_510);
  boost::detail::shared_count::~shared_count(&sStack_4a0);
  local_200 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field_operators.cpp"
  ;
  local_1f8 = "";
  local_210 = &boost::unit_test::basic_cstring<char_const>::null;
  local_208 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_200,0x3c);
  local_4c8 = (char *)((ulong)local_4c8 & 0xffffffffffffff00);
  local_4d0 = &PTR__lazy_ostream_00120ce0;
  local_4c0 = &boost::unit_test::lazy_ostream::inst;
  local_4b8 = "";
  local_52c[0] = pZVar1->characteristic_;
  uVar3 = uVar6;
  if (local_52c[0] <= uVar6) {
    uVar3 = uVar6 % local_52c[0];
  }
  uVar5 = 3;
  if (local_52c[0] < 4) {
    uVar5 = (uint)(byte)(3 % (byte)local_52c[0]);
  }
  if (uVar5 <= uVar3) {
    local_52c[0] = 0;
  }
  local_52c[0] = local_52c[0] + (uVar3 - uVar5);
  local_4b0[0] = local_52c[0] == 1;
  local_52c[1] = 1;
  local_4a8 = 0;
  sStack_4a0.pi_ = (sp_counted_base *)0x0;
  local_490 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field_operators.cpp"
  ;
  local_488 = "";
  local_518 = local_52c;
  local_4e8 = 0;
  local_4f0 = &PTR__lazy_ostream_00120d20;
  local_4e0 = &boost::unit_test::lazy_ostream::inst;
  local_4d8 = (undefined ***)&local_518;
  local_520 = local_52c + 1;
  local_508 = local_508 & 0xffffffffffffff00;
  local_510 = &PTR__lazy_ostream_00120ca0;
  sStack_500.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_4f8 = &local_520;
  boost::test_tools::tt_detail::report_assertion
            (local_4b0,&local_4d0,&local_490,0x3c,1,2,2,"op.subtract(z23, T(3))",&local_4f0,"1",
             &local_510);
  boost::detail::shared_count::~shared_count(&sStack_4a0);
  local_220 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field_operators.cpp"
  ;
  local_218 = "";
  local_230 = &boost::unit_test::basic_cstring<char_const>::null;
  local_228 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_220,0x3d);
  local_4c8 = (char *)((ulong)local_4c8 & 0xffffffffffffff00);
  local_4d0 = &PTR__lazy_ostream_00120ce0;
  local_4c0 = &boost::unit_test::lazy_ostream::inst;
  local_4b8 = "";
  local_52c[0] = pZVar1->characteristic_;
  uVar3 = (uint)local_498;
  if (uVar3 < local_52c[0]) {
    uVar5 = 3;
    if (3 < local_52c[0]) goto LAB_0010947a;
  }
  else {
    uVar3 = (uint)(byte)(((ushort)local_498 & 0xff) % (ushort)(byte)local_52c[0]);
  }
  uVar5 = (uint)(byte)(3 % (byte)local_52c[0]);
LAB_0010947a:
  if (uVar5 <= uVar3) {
    local_52c[0] = 0;
  }
  local_52c[0] = (uVar3 - uVar5) + local_52c[0];
  local_4b0[0] = local_52c[0] == 1;
  local_52c[1] = 1;
  local_4a8 = 0;
  sStack_4a0.pi_ = (sp_counted_base *)0x0;
  local_490 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field_operators.cpp"
  ;
  local_488 = "";
  local_518 = local_52c;
  local_4e8 = 0;
  local_4f0 = &PTR__lazy_ostream_00120d20;
  local_4e0 = &boost::unit_test::lazy_ostream::inst;
  local_4d8 = (undefined ***)&local_518;
  local_520 = local_52c + 1;
  local_508 = local_508 & 0xffffffffffffff00;
  local_510 = &PTR__lazy_ostream_00120ca0;
  sStack_500.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_4f8 = &local_520;
  boost::test_tools::tt_detail::report_assertion
            (local_4b0,&local_4d0,&local_490,0x3d,1,2,2,"op.subtract(z24, T(3))",&local_4f0,"1",
             &local_510);
  boost::detail::shared_count::~shared_count(&sStack_4a0);
  local_240 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field_operators.cpp"
  ;
  local_238 = "";
  local_250 = &boost::unit_test::basic_cstring<char_const>::null;
  local_248 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_240,0x3e);
  local_4c8 = (char *)((ulong)local_4c8 & 0xffffffffffffff00);
  local_4d0 = &PTR__lazy_ostream_00120ce0;
  local_4c0 = &boost::unit_test::lazy_ostream::inst;
  local_4b8 = "";
  local_52c[0] = pZVar1->characteristic_;
  uVar3 = 6;
  if (local_52c[0] < 7) {
    uVar3 = (uint)(byte)(6 % (byte)local_52c[0]);
  }
  if (local_52c[0] <= uVar6) {
    uVar6 = uVar6 % local_52c[0];
  }
  if (uVar6 <= uVar3) {
    local_52c[0] = 0;
  }
  local_52c[0] = local_52c[0] + (uVar3 - uVar6);
  local_4b0[0] = local_52c[0] == 0;
  local_52c[1] = 0;
  local_4a8 = 0;
  sStack_4a0.pi_ = (sp_counted_base *)0x0;
  local_490 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field_operators.cpp"
  ;
  local_488 = "";
  local_518 = local_52c;
  local_4e8 = 0;
  local_4f0 = &PTR__lazy_ostream_00120d20;
  local_4e0 = &boost::unit_test::lazy_ostream::inst;
  local_4d8 = (undefined ***)&local_518;
  local_520 = local_52c + 1;
  local_508 = local_508 & 0xffffffffffffff00;
  local_510 = &PTR__lazy_ostream_00120ca0;
  sStack_500.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_4f8 = &local_520;
  boost::test_tools::tt_detail::report_assertion
            (local_4b0,&local_4d0,&local_490,0x3e,1,2,2,"op.subtract(op.get_value(6u), z23)",
             &local_4f0,"0",&local_510);
  boost::detail::shared_count::~shared_count(&sStack_4a0);
  local_260 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field_operators.cpp"
  ;
  local_258 = "";
  local_270 = &boost::unit_test::basic_cstring<char_const>::null;
  local_268 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_260,0x3f);
  local_4c8 = (char *)((ulong)local_4c8 & 0xffffffffffffff00);
  local_4d0 = &PTR__lazy_ostream_00120ce0;
  local_4c0 = &boost::unit_test::lazy_ostream::inst;
  local_4b8 = "";
  local_52c[0] = pZVar1->characteristic_;
  uVar6 = 6;
  if (local_52c[0] < 7) {
    uVar6 = (uint)(byte)(6 % (byte)local_52c[0]);
  }
  uVar3 = (uint)local_498;
  local_518 = local_52c;
  local_4d8 = (undefined ***)&local_518;
  local_4f8 = &local_520;
  if (local_52c[0] <= uVar3) {
    uVar3 = (uint)(byte)(((ushort)local_498 & 0xff) % (ushort)(byte)local_52c[0]);
  }
  if (uVar3 <= uVar6) {
    local_52c[0] = 0;
  }
  local_52c[0] = local_52c[0] + (uVar6 - uVar3);
  local_4b0[0] = local_52c[0] == 0;
  local_52c[1] = 0;
  local_4a8 = 0;
  sStack_4a0.pi_ = (sp_counted_base *)0x0;
  local_490 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field_operators.cpp"
  ;
  local_488 = "";
  local_4e8 = 0;
  local_4f0 = &PTR__lazy_ostream_00120d20;
  local_4e0 = &boost::unit_test::lazy_ostream::inst;
  local_520 = local_52c + 1;
  local_508 = local_508 & 0xffffffffffffff00;
  local_510 = &PTR__lazy_ostream_00120ca0;
  sStack_500.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  boost::test_tools::tt_detail::report_assertion
            (local_4b0,&local_4d0,&local_490,0x3f,1,2,2,"op.subtract(op.get_value(6u), z24)",
             &local_4f0,"0",&local_510);
  boost::detail::shared_count::~shared_count(&sStack_4a0);
  uVar6 = pZVar1->characteristic_;
  if (uVar6 <= z21) {
    z21 = z21 % uVar6;
  }
  uVar3 = 3;
  if (uVar6 < 4) {
    uVar3 = (uint)(byte)(3 % (byte)uVar6);
  }
  if (uVar3 <= z21) {
    uVar6 = 0;
  }
  z21 = (z21 - uVar3) + uVar6;
  local_280 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field_operators.cpp"
  ;
  local_278 = "";
  local_290 = &boost::unit_test::basic_cstring<char_const>::null;
  local_288 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_280,0x41);
  local_4c8 = (char *)((ulong)local_4c8 & 0xffffffffffffff00);
  local_4d0 = &PTR__lazy_ostream_00120ce0;
  local_4c0 = &boost::unit_test::lazy_ostream::inst;
  local_4b8 = "";
  local_4b0[0] = z21 == 1;
  local_52c[0] = 1;
  local_4a8 = 0;
  sStack_4a0.pi_ = (sp_counted_base *)0x0;
  local_490 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field_operators.cpp"
  ;
  local_488 = "";
  local_518 = &z21;
  local_4e8 = 0;
  local_4f0 = &PTR__lazy_ostream_00120d20;
  local_4e0 = &boost::unit_test::lazy_ostream::inst;
  local_4d8 = (undefined ***)&local_518;
  local_520 = local_52c;
  local_508 = local_508 & 0xffffffffffffff00;
  local_510 = &PTR__lazy_ostream_00120ca0;
  sStack_500.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_4f8 = &local_520;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_4a0);
  uVar6 = pZVar1->characteristic_;
  if (uVar6 <= z21) {
    z21 = z21 % uVar6;
  }
  uVar3 = 2;
  if (uVar6 < 3) {
    uVar3 = (uint)(byte)(2 % (byte)uVar6);
  }
  if (uVar3 <= z21) {
    uVar6 = 0;
  }
  z21 = (z21 - uVar3) + uVar6;
  local_2a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field_operators.cpp"
  ;
  local_298 = "";
  local_2b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2a8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_2a0,0x43);
  local_4c8 = (char *)((ulong)local_4c8 & 0xffffffffffffff00);
  local_4d0 = &PTR__lazy_ostream_00120ce0;
  local_4c0 = &boost::unit_test::lazy_ostream::inst;
  local_4b8 = "";
  local_4b0[0] = z21 == 1;
  local_52c[0] = 1;
  local_4a8 = 0;
  sStack_4a0.pi_ = (sp_counted_base *)0x0;
  local_490 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field_operators.cpp"
  ;
  local_488 = "";
  local_518 = &z21;
  local_4e8 = 0;
  local_4f0 = &PTR__lazy_ostream_00120d20;
  local_4e0 = &boost::unit_test::lazy_ostream::inst;
  local_4d8 = (undefined ***)&local_518;
  local_520 = local_52c;
  local_508 = local_508 & 0xffffffffffffff00;
  local_510 = &PTR__lazy_ostream_00120ca0;
  sStack_500.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_4f8 = &local_520;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_4a0);
  uVar6 = z21;
  if (pZVar1->characteristic_ <= z21) {
    uVar6 = z21 % pZVar1->characteristic_;
  }
  local_2c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field_operators.cpp"
  ;
  local_2b8 = "";
  local_2d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2c8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_2c0,0x47);
  local_4c8 = (char *)((ulong)local_4c8 & 0xffffffffffffff00);
  local_4d0 = &PTR__lazy_ostream_00120ce0;
  local_4c0 = &boost::unit_test::lazy_ostream::inst;
  local_4b8 = "";
  local_52c[0] = Gudhi::persistence_fields::Zp_field_operators<unsigned_int,_void>::multiply
                           (pZVar1,z21,2);
  local_52c[1] = 0;
  local_4b0[0] = local_52c[0] == 0;
  local_4a8 = 0;
  sStack_4a0.pi_ = (sp_counted_base *)0x0;
  local_490 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field_operators.cpp"
  ;
  local_488 = "";
  local_518 = local_52c;
  local_4e8 = 0;
  local_4f0 = &PTR__lazy_ostream_00120d20;
  local_4e0 = &boost::unit_test::lazy_ostream::inst;
  local_4d8 = (undefined ***)&local_518;
  local_520 = local_52c + 1;
  local_508 = local_508 & 0xffffffffffffff00;
  local_510 = &PTR__lazy_ostream_00120ca0;
  sStack_500.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_4f8 = &local_520;
  boost::test_tools::tt_detail::report_assertion
            (local_4b0,&local_4d0,&local_490,0x47,1,2,2,"op.multiply(z21, z22)",&local_4f0,"0",
             &local_510);
  boost::detail::shared_count::~shared_count(&sStack_4a0);
  local_2e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field_operators.cpp"
  ;
  local_2d8 = "";
  local_2f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2e8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_2e0,0x48);
  local_4c8 = (char *)((ulong)local_4c8 & 0xffffffffffffff00);
  local_4d0 = &PTR__lazy_ostream_00120ce0;
  local_4c0 = &boost::unit_test::lazy_ostream::inst;
  local_4b8 = "";
  local_52c[0] = Gudhi::persistence_fields::Zp_field_operators<unsigned_int,_void>::multiply
                           (pZVar1,uVar6,(Element_conflict)local_498);
  local_52c[1] = 0;
  local_4b0[0] = local_52c[0] == 0;
  local_4a8 = 0;
  sStack_4a0.pi_ = (sp_counted_base *)0x0;
  local_490 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field_operators.cpp"
  ;
  local_488 = "";
  local_518 = local_52c;
  local_4e8 = 0;
  local_4f0 = &PTR__lazy_ostream_00120d20;
  local_4e0 = &boost::unit_test::lazy_ostream::inst;
  local_4d8 = (undefined ***)&local_518;
  local_520 = local_52c + 1;
  local_508 = local_508 & 0xffffffffffffff00;
  local_510 = &PTR__lazy_ostream_00120ca0;
  sStack_500.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_4f8 = &local_520;
  boost::test_tools::tt_detail::report_assertion
            (local_4b0,&local_4d0,&local_490,0x48,1,2,2,"op.multiply(z23, z24)",&local_4f0,"0",
             &local_510);
  boost::detail::shared_count::~shared_count(&sStack_4a0);
  local_300 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field_operators.cpp"
  ;
  local_2f8 = "";
  local_310 = &boost::unit_test::basic_cstring<char_const>::null;
  local_308 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_300,0x49);
  local_4c8 = (char *)((ulong)local_4c8 & 0xffffffffffffff00);
  local_4d0 = &PTR__lazy_ostream_00120ce0;
  local_4c0 = &boost::unit_test::lazy_ostream::inst;
  local_4b8 = "";
  local_52c[0] = Gudhi::persistence_fields::Zp_field_operators<unsigned_int,_void>::multiply
                           (pZVar1,uVar6,3);
  local_52c[1] = 1;
  local_4b0[0] = local_52c[0] == 1;
  local_4a8 = 0;
  sStack_4a0.pi_ = (sp_counted_base *)0x0;
  local_490 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field_operators.cpp"
  ;
  local_488 = "";
  local_518 = local_52c;
  local_4e8 = 0;
  local_4f0 = &PTR__lazy_ostream_00120d20;
  local_4e0 = &boost::unit_test::lazy_ostream::inst;
  local_4d8 = (undefined ***)&local_518;
  local_520 = local_52c + 1;
  local_508 = local_508 & 0xffffffffffffff00;
  local_510 = &PTR__lazy_ostream_00120ca0;
  sStack_500.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_4f8 = &local_520;
  boost::test_tools::tt_detail::report_assertion
            (local_4b0,&local_4d0,&local_490,0x49,1,2,2,"op.multiply(z23, T(3))",&local_4f0,"1",
             &local_510);
  boost::detail::shared_count::~shared_count(&sStack_4a0);
  local_320 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field_operators.cpp"
  ;
  local_318 = "";
  local_330 = &boost::unit_test::basic_cstring<char_const>::null;
  local_328 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_320,0x4a);
  local_4c8 = (char *)((ulong)local_4c8 & 0xffffffffffffff00);
  local_4d0 = &PTR__lazy_ostream_00120ce0;
  local_4c0 = &boost::unit_test::lazy_ostream::inst;
  local_4b8 = "";
  local_52c[0] = Gudhi::persistence_fields::Zp_field_operators<unsigned_int,_void>::multiply
                           (pZVar1,(Element_conflict)local_498,3);
  local_52c[1] = 0;
  local_4b0[0] = local_52c[0] == 0;
  local_4a8 = 0;
  sStack_4a0.pi_ = (sp_counted_base *)0x0;
  local_490 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field_operators.cpp"
  ;
  local_488 = "";
  local_518 = local_52c;
  local_4e8 = 0;
  local_4f0 = &PTR__lazy_ostream_00120d20;
  local_4e0 = &boost::unit_test::lazy_ostream::inst;
  local_4d8 = (undefined ***)&local_518;
  local_520 = local_52c + 1;
  local_508 = local_508 & 0xffffffffffffff00;
  local_510 = &PTR__lazy_ostream_00120ca0;
  sStack_500.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_4f8 = &local_520;
  boost::test_tools::tt_detail::report_assertion
            (local_4b0,&local_4d0,&local_490,0x4a,1,2,2,"op.multiply(z24, T(3))",&local_4f0,"0",
             &local_510);
  boost::detail::shared_count::~shared_count(&sStack_4a0);
  local_340 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field_operators.cpp"
  ;
  local_338 = "";
  local_350 = &boost::unit_test::basic_cstring<char_const>::null;
  local_348 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_340,0x4b);
  local_4c8 = (char *)((ulong)local_4c8 & 0xffffffffffffff00);
  local_4d0 = &PTR__lazy_ostream_00120ce0;
  local_4c0 = &boost::unit_test::lazy_ostream::inst;
  local_4b8 = "";
  uVar3 = 6;
  if (pZVar1->characteristic_ < 7) {
    uVar3 = (uint)(byte)(6 % (byte)pZVar1->characteristic_);
  }
  local_52c[0] = Gudhi::persistence_fields::Zp_field_operators<unsigned_int,_void>::multiply
                           (pZVar1,uVar3,uVar6);
  local_52c[1] = 0;
  local_4b0[0] = local_52c[0] == 0;
  local_4a8 = 0;
  sStack_4a0.pi_ = (sp_counted_base *)0x0;
  local_490 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field_operators.cpp"
  ;
  local_488 = "";
  local_518 = local_52c;
  local_4e8 = 0;
  local_4f0 = &PTR__lazy_ostream_00120d20;
  local_4e0 = &boost::unit_test::lazy_ostream::inst;
  local_4d8 = (undefined ***)&local_518;
  local_520 = local_52c + 1;
  local_508 = local_508 & 0xffffffffffffff00;
  local_510 = &PTR__lazy_ostream_00120ca0;
  sStack_500.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_4f8 = &local_520;
  boost::test_tools::tt_detail::report_assertion
            (local_4b0,&local_4d0,&local_490,0x4b,1,2,2,"op.multiply(op.get_value(6u), z23)",
             &local_4f0,"0",&local_510);
  boost::detail::shared_count::~shared_count(&sStack_4a0);
  local_360 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field_operators.cpp"
  ;
  local_358 = "";
  local_370 = &boost::unit_test::basic_cstring<char_const>::null;
  local_368 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_360,0x4c);
  local_4c8 = (char *)((ulong)local_4c8 & 0xffffffffffffff00);
  local_4d0 = &PTR__lazy_ostream_00120ce0;
  local_4c0 = &boost::unit_test::lazy_ostream::inst;
  local_4b8 = "";
  uVar6 = 6;
  if (pZVar1->characteristic_ < 7) {
    uVar6 = (uint)(byte)(6 % (byte)pZVar1->characteristic_);
  }
  local_52c[0] = Gudhi::persistence_fields::Zp_field_operators<unsigned_int,_void>::multiply
                           (pZVar1,uVar6,(Element_conflict)local_498);
  local_52c[1] = 0;
  local_4b0[0] = local_52c[0] == 0;
  local_4a8 = 0;
  sStack_4a0.pi_ = (sp_counted_base *)0x0;
  local_490 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field_operators.cpp"
  ;
  local_488 = "";
  local_518 = local_52c;
  local_4e8 = 0;
  local_4f0 = &PTR__lazy_ostream_00120d20;
  local_4e0 = &boost::unit_test::lazy_ostream::inst;
  local_4d8 = (undefined ***)&local_518;
  local_520 = local_52c + 1;
  local_508 = local_508 & 0xffffffffffffff00;
  local_510 = &PTR__lazy_ostream_00120ca0;
  sStack_500.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_4f8 = &local_520;
  boost::test_tools::tt_detail::report_assertion
            (local_4b0,&local_4d0,&local_490,0x4c,1,2,2,"op.multiply(op.get_value(6u), z24)",
             &local_4f0,"0",&local_510);
  boost::detail::shared_count::~shared_count(&sStack_4a0);
  z21 = Gudhi::persistence_fields::Zp_field_operators<unsigned_int,_void>::multiply(pZVar1,z21,3);
  local_380 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field_operators.cpp"
  ;
  local_378 = "";
  local_390 = &boost::unit_test::basic_cstring<char_const>::null;
  local_388 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_380,0x4e);
  local_4c8 = (char *)((ulong)local_4c8 & 0xffffffffffffff00);
  local_4d0 = &PTR__lazy_ostream_00120ce0;
  local_4b0[0] = z21 == 1;
  local_4c0 = &boost::unit_test::lazy_ostream::inst;
  local_4b8 = "";
  local_52c[0] = 1;
  local_4a8 = 0;
  sStack_4a0.pi_ = (sp_counted_base *)0x0;
  local_490 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field_operators.cpp"
  ;
  local_488 = "";
  local_518 = &z21;
  local_4e8 = 0;
  local_4f0 = &PTR__lazy_ostream_00120d20;
  local_4e0 = &boost::unit_test::lazy_ostream::inst;
  local_4d8 = (undefined ***)&local_518;
  local_520 = local_52c;
  local_508 = local_508 & 0xffffffffffffff00;
  local_510 = &PTR__lazy_ostream_00120ca0;
  sStack_500.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_4f8 = &local_520;
  boost::test_tools::tt_detail::report_assertion
            (local_4b0,&local_4d0,&local_490,0x4e,1,2,2,"z21",&local_4f0,"1",&local_510);
  boost::detail::shared_count::~shared_count(&sStack_4a0);
  z21 = Gudhi::persistence_fields::Zp_field_operators<unsigned_int,_void>::multiply(pZVar1,z21,2);
  local_3a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field_operators.cpp"
  ;
  local_398 = "";
  local_3b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3a8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_3a0,0x50);
  local_4c8 = (char *)((ulong)local_4c8 & 0xffffffffffffff00);
  local_4d0 = &PTR__lazy_ostream_00120ce0;
  local_4c0 = &boost::unit_test::lazy_ostream::inst;
  local_4b0[0] = z21 == 0;
  local_4b8 = "";
  local_52c[0] = 0;
  local_4a8 = 0;
  sStack_4a0.pi_ = (sp_counted_base *)0x0;
  local_490 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field_operators.cpp"
  ;
  local_488 = "";
  local_518 = &z21;
  local_4e8 = 0;
  local_4f0 = &PTR__lazy_ostream_00120d20;
  local_4e0 = &boost::unit_test::lazy_ostream::inst;
  local_4d8 = (undefined ***)&local_518;
  local_520 = local_52c;
  local_508 = local_508 & 0xffffffffffffff00;
  local_510 = &PTR__lazy_ostream_00120ca0;
  sStack_500.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_4f8 = &local_520;
  boost::test_tools::tt_detail::report_assertion
            (local_4b0,&local_4d0,&local_490,0x50,1,2,2,"z21",&local_4f0,"0",&local_510);
  boost::detail::shared_count::~shared_count(&sStack_4a0);
  uVar6 = z21;
  if (pZVar1->characteristic_ <= z21) {
    uVar6 = z21 % pZVar1->characteristic_;
  }
  local_3c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field_operators.cpp"
  ;
  local_3b8 = "";
  local_3d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3c8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_3c0,0x54);
  uVar3 = z21;
  if (pZVar1->characteristic_ <= z21) {
    uVar3 = z21 % pZVar1->characteristic_;
  }
  local_508 = 0;
  sStack_500.pi_ = (sp_counted_base *)0x0;
  local_4d0 = (undefined **)0x11a46c;
  local_4c8 = "";
  local_4e8 = 0;
  local_4f0 = &PTR__lazy_ostream_00120d60;
  local_4e0 = &boost::unit_test::lazy_ostream::inst;
  local_3e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field_operators.cpp"
  ;
  local_3d8 = "";
  local_4d8 = &local_4d0;
  local_510._0_1_ = uVar3 == 0;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_500);
  local_3f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field_operators.cpp"
  ;
  local_3e8 = "";
  local_400 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3f8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_3f0,0x55);
  uVar3 = pZVar1->characteristic_;
  uVar5 = z21;
  if (uVar3 <= z21) {
    uVar5 = z21 % uVar3;
  }
  uVar2 = 2;
  if (uVar3 < 3) {
    uVar2 = (uint)(byte)(2 % (byte)uVar3);
  }
  local_510._0_1_ = uVar5 == uVar2;
  local_508 = 0;
  sStack_500.pi_ = (sp_counted_base *)0x0;
  local_4d0 = (undefined **)0x11a482;
  local_4c8 = "";
  local_4e8 = 0;
  local_4f0 = &PTR__lazy_ostream_00120d60;
  local_4e0 = &boost::unit_test::lazy_ostream::inst;
  local_410 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field_operators.cpp"
  ;
  local_408 = "";
  local_4d8 = &local_4d0;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_500);
  local_420 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field_operators.cpp"
  ;
  local_418 = "";
  local_430 = &boost::unit_test::basic_cstring<char_const>::null;
  local_428 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_420,0x56);
  uVar3 = pZVar1->characteristic_;
  uVar5 = z21;
  if (uVar3 <= z21) {
    uVar5 = z21 % uVar3;
  }
  if (uVar3 <= uVar6) {
    uVar6 = uVar6 % uVar3;
  }
  local_510._0_1_ = uVar5 == uVar6;
  local_508 = 0;
  sStack_500.pi_ = (sp_counted_base *)0x0;
  local_4d0 = (undefined **)0x11a499;
  local_4c8 = "";
  local_4e8 = 0;
  local_4f0 = &PTR__lazy_ostream_00120d60;
  local_4e0 = &boost::unit_test::lazy_ostream::inst;
  local_440 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field_operators.cpp"
  ;
  local_438 = "";
  local_4d8 = &local_4d0;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_500);
  local_450 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field_operators.cpp"
  ;
  local_448 = "";
  local_460 = &boost::unit_test::basic_cstring<char_const>::null;
  local_458 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_450,0x57);
  uVar6 = pZVar1->characteristic_;
  uVar3 = z21;
  if (uVar6 <= z21) {
    uVar3 = z21 % uVar6;
  }
  uVar5 = (uint)local_498;
  if (uVar6 <= uVar5) {
    uVar5 = (uint)(byte)(((ushort)local_498 & 0xff) % (ushort)(byte)uVar6);
  }
  local_510 = (undefined **)CONCAT71(local_510._1_7_,uVar3 == uVar5);
  local_508 = 0;
  sStack_500.pi_ = (sp_counted_base *)0x0;
  local_4d0 = (undefined **)0x11a4be;
  local_4c8 = "";
  local_4e8 = 0;
  local_4f0 = &PTR__lazy_ostream_00120d60;
  local_4e0 = &boost::unit_test::lazy_ostream::inst;
  local_470 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field_operators.cpp"
  ;
  local_468 = "";
  local_4d8 = &local_4d0;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_500);
  return;
}

Assistant:

void test_z2_standart_field_operators(Z2& op) {
  using T = typename Z2::Element;

  unsigned int z21 = 7u;
  unsigned int z22 = 2u;
  T z23 = op.get_value(7u);
  T z24 = op.get_value(2u);

  // e * m + a
  BOOST_CHECK_EQUAL(op.multiply_and_add(z21, z22, 3u), 1);
  BOOST_CHECK_EQUAL(op.multiply_and_add(z23, z24, T(3)), 1);

  //(e + a) * m
  BOOST_CHECK_EQUAL(op.add_and_multiply(z21, z22, 3u), 1);
  BOOST_CHECK_EQUAL(op.add_and_multiply(z23, z24, T(3)), 1);

  //+
  BOOST_CHECK_EQUAL(op.add(z21, z22), 1);
  BOOST_CHECK_EQUAL(op.add(z23, z24), 1);
  BOOST_CHECK_EQUAL(op.add(z23, T(3)), 0);
  BOOST_CHECK_EQUAL(op.add(z24, T(3)), 1);
  BOOST_CHECK_EQUAL(op.add(op.get_value(6u), z23), 1);
  BOOST_CHECK_EQUAL(op.add(op.get_value(6u), z24), 0);
  z21 = op.add(z21, 3u);
  BOOST_CHECK_EQUAL(z21, 0);
  z21 = op.add(z21, z22);
  BOOST_CHECK_EQUAL(z21, 0);
  z23 = op.get_value(z21);

  //-
  BOOST_CHECK_EQUAL(op.subtract(z21, z22), 0);
  BOOST_CHECK_EQUAL(op.subtract(z23, z24), 0);
  BOOST_CHECK_EQUAL(op.subtract(z23, T(3)), 1);
  BOOST_CHECK_EQUAL(op.subtract(z24, T(3)), 1);
  BOOST_CHECK_EQUAL(op.subtract(op.get_value(6u), z23), 0);
  BOOST_CHECK_EQUAL(op.subtract(op.get_value(6u), z24), 0);
  z21 = op.subtract(z21, 3u);
  BOOST_CHECK_EQUAL(z21, 1);
  z21 = op.subtract(z21, z22);
  BOOST_CHECK_EQUAL(z21, 1);
  z23 = op.get_value(z21);

  //*
  BOOST_CHECK_EQUAL(op.multiply(z21, z22), 0);
  BOOST_CHECK_EQUAL(op.multiply(z23, z24), 0);
  BOOST_CHECK_EQUAL(op.multiply(z23, T(3)), 1);
  BOOST_CHECK_EQUAL(op.multiply(z24, T(3)), 0);
  BOOST_CHECK_EQUAL(op.multiply(op.get_value(6u), z23), 0);
  BOOST_CHECK_EQUAL(op.multiply(op.get_value(6u), z24), 0);
  z21 = op.multiply(z21, 3u);
  BOOST_CHECK_EQUAL(z21, 1);
  z21 = op.multiply(z21, z22);
  BOOST_CHECK_EQUAL(z21, 0);
  z23 = op.get_value(z21);

  //==
  BOOST_CHECK(op.are_equal(z21, 0u));
  BOOST_CHECK(op.are_equal(z21, z22));
  BOOST_CHECK(op.are_equal(op.get_value(z21), z23));
  BOOST_CHECK(op.are_equal(op.get_value(z21), z24));
}